

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyb_skip_subtree(char *data,lyb_state *lybs)

{
  int iVar1;
  int iVar2;
  char *data_00;
  int local_28;
  int ret;
  int r;
  lyb_state *lybs_local;
  char *data_local;
  
  local_28 = 0;
  lybs_local = (lyb_state *)data;
  do {
    iVar1 = (uint)lybs->inner_chunks[lybs->used + -1] * 2;
    data_00 = (char *)((long)&lybs_local->written + (long)iVar1);
    iVar2 = lyb_read(data_00,(uint8_t *)0x0,lybs->written[lybs->used + -1],lybs);
    local_28 = iVar2 + iVar1 + local_28;
    if (iVar2 < 0) {
      return -1;
    }
    lybs_local = (lyb_state *)(data_00 + iVar2);
  } while (lybs->written[lybs->used + -1] != 0);
  return local_28;
}

Assistant:

static int
lyb_skip_subtree(const char *data, struct lyb_state *lybs)
{
    int r, ret = 0;

    do {
        /* first skip any meta information inside */
        r = lybs->inner_chunks[lybs->used - 1] * LYB_META_BYTES;
        data += r;
        ret += r;

        /* then read data */
        ret += (r = lyb_read(data, NULL, lybs->written[lybs->used - 1], lybs));
        LYB_HAVE_READ_RETURN(r, data, -1);
    } while (lybs->written[lybs->used - 1]);

    return ret;
}